

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O3

NodeRef __thiscall
embree::avx::BVHNBuilderQuantizedVirtual<4>::
BVHNBuilderT<embree::avx::CreateLeafQuantized<4,_embree::QuadMv<4>_>_>::createLeaf
          (BVHNBuilderT<embree::avx::CreateLeafQuantized<4,_embree::QuadMv<4>_>_> *this,
          PrimRef *prims,range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  undefined4 *puVar2;
  undefined4 *puVar3;
  pointer *pppTVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  FastAllocator *this_00;
  ThreadLocal *pTVar8;
  ThreadLocal2 *pTVar9;
  iterator __position;
  Ref<embree::Geometry> *pRVar10;
  Geometry *pGVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  ThreadLocal2 *pTVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  ulong uVar19;
  ulong uVar20;
  char *pcVar21;
  undefined1 (*pauVar22) [16];
  size_t sVar23;
  ulong uVar24;
  long lVar25;
  unsigned_long uVar26;
  long lVar27;
  float *pfVar28;
  ulong uVar29;
  long lVar30;
  undefined1 auVar31 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar32 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  vuint<4> vprimID;
  vuint<4> vgeomID;
  ThreadLocal2 *local_128;
  undefined1 uStack_120;
  undefined7 uStack_11f;
  undefined1 auStack_118 [16];
  undefined1 auStack_108 [16];
  ThreadLocal2 *local_f8;
  char cStack_f0;
  undefined7 uStack_ef;
  undefined1 auStack_e8 [16];
  undefined1 auStack_d8 [16];
  long local_c8;
  BVHNBuilderT<embree::avx::CreateLeafQuantized<4,_embree::QuadMv<4>_>_> *local_c0;
  ThreadLocal2 *local_b8;
  undefined8 uStack_b0;
  undefined1 auStack_a8 [16];
  undefined1 auStack_98 [16];
  ThreadLocal2 *local_88;
  undefined8 uStack_80;
  undefined1 auStack_78 [16];
  undefined1 auStack_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  auVar36 = in_ZMM3._0_16_;
  auVar32 = in_ZMM1._0_16_;
  uVar26 = set->_begin;
  uVar19 = (set->_end - uVar26) + 3;
  uVar20 = uVar19 >> 2;
  local_b8 = (ThreadLocal2 *)(uVar20 * 0xe0);
  this_00 = alloc->alloc;
  pTVar8 = alloc->talloc1;
  pTVar9 = pTVar8->parent;
  if (this_00 != (pTVar9->alloc)._M_b._M_p) {
    cStack_f0 = '\x01';
    local_f8 = pTVar9;
    MutexSys::lock(&pTVar9->mutex);
    if ((pTVar9->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((pTVar9->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar9->alloc1).bytesUsed + (pTVar9->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar9->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar9->alloc0).end + (pTVar9->alloc1).end) -
           ((pTVar9->alloc0).cur + (pTVar9->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar9->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar9->alloc1).bytesWasted + (pTVar9->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar31 = ZEXT1632(ZEXT816(0) << 0x40);
    (pTVar9->alloc0).end = auVar31._0_8_;
    (pTVar9->alloc0).allocBlockSize = auVar31._8_8_;
    (pTVar9->alloc0).bytesUsed = auVar31._16_8_;
    (pTVar9->alloc0).bytesWasted = auVar31._24_8_;
    (pTVar9->alloc0).ptr = (char *)auVar31._0_8_;
    (pTVar9->alloc0).cur = auVar31._8_8_;
    (pTVar9->alloc0).end = auVar31._16_8_;
    (pTVar9->alloc0).allocBlockSize = auVar31._24_8_;
    auVar31 = ZEXT1632(ZEXT816(0) << 0x40);
    if (this_00 == (FastAllocator *)0x0) {
      (pTVar9->alloc1).end = auVar31._0_8_;
      (pTVar9->alloc1).allocBlockSize = auVar31._8_8_;
      (pTVar9->alloc1).bytesUsed = auVar31._16_8_;
      (pTVar9->alloc1).bytesWasted = auVar31._24_8_;
      (pTVar9->alloc1).ptr = (char *)auVar31._0_8_;
      (pTVar9->alloc1).cur = auVar31._8_8_;
      (pTVar9->alloc1).end = auVar31._16_8_;
      (pTVar9->alloc1).allocBlockSize = auVar31._24_8_;
    }
    else {
      (pTVar9->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (pTVar9->alloc1).ptr = (char *)auVar31._0_8_;
      (pTVar9->alloc1).cur = auVar31._8_8_;
      (pTVar9->alloc1).end = auVar31._16_8_;
      (pTVar9->alloc1).allocBlockSize = auVar31._24_8_;
      (pTVar9->alloc1).end = auVar31._0_8_;
      (pTVar9->alloc1).allocBlockSize = auVar31._8_8_;
      (pTVar9->alloc1).bytesUsed = auVar31._16_8_;
      (pTVar9->alloc1).bytesWasted = auVar31._24_8_;
      (pTVar9->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (pTVar9->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_128 = (ThreadLocal2 *)&FastAllocator::s_thread_local_allocators_lock;
    uStack_120 = 1;
    in_ZMM1 = ZEXT1664(auVar32);
    in_ZMM3 = ZEXT1664(auVar36);
    local_88 = pTVar9;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,&local_88);
    }
    else {
      *__position._M_current = pTVar9;
      pppTVar4 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar4 = *pppTVar4 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (cStack_f0 == '\x01') {
      MutexSys::unlock(&local_f8->mutex);
    }
  }
  pTVar9 = local_b8;
  pTVar8->bytesUsed = (long)&(local_b8->mutex).mutex + pTVar8->bytesUsed;
  sVar23 = pTVar8->cur;
  uVar24 = (ulong)(-(int)sVar23 & 0xf);
  uVar29 = (long)&(local_b8->mutex).mutex + uVar24 + sVar23;
  pTVar8->cur = uVar29;
  if (pTVar8->end < uVar29) {
    pTVar8->cur = sVar23;
    pTVar14 = (ThreadLocal2 *)pTVar8->allocBlockSize;
    if ((ThreadLocal2 *)((long)local_b8 * 4) < pTVar14 || (long)local_b8 * 4 - (long)pTVar14 == 0) {
      local_128 = pTVar14;
      pcVar21 = (char *)FastAllocator::malloc(this_00,(size_t)&local_128);
      pTVar8->ptr = pcVar21;
      sVar23 = (pTVar8->end - pTVar8->cur) + pTVar8->bytesWasted;
      pTVar8->bytesWasted = sVar23;
      pTVar8->end = (size_t)local_128;
      pTVar8->cur = (size_t)pTVar9;
      if (local_128 < pTVar9) {
        pTVar8->cur = 0;
        local_128 = (ThreadLocal2 *)pTVar8->allocBlockSize;
        pcVar21 = (char *)FastAllocator::malloc(this_00,(size_t)&local_128);
        pTVar8->ptr = pcVar21;
        sVar23 = (pTVar8->end - pTVar8->cur) + pTVar8->bytesWasted;
        pTVar8->bytesWasted = sVar23;
        pTVar8->end = (size_t)local_128;
        pTVar8->cur = (size_t)pTVar9;
        if (local_128 < pTVar9) {
          pTVar8->cur = 0;
          pcVar21 = (char *)0x0;
          goto LAB_012ad6d9;
        }
      }
      pTVar8->bytesWasted = sVar23;
    }
    else {
      pcVar21 = (char *)FastAllocator::malloc(this_00,(size_t)&local_b8);
    }
  }
  else {
    pTVar8->bytesWasted = pTVar8->bytesWasted + uVar24;
    pcVar21 = pTVar8->ptr + (uVar29 - (long)local_b8);
  }
LAB_012ad6d9:
  if (3 < uVar19) {
    lVar27 = uVar20 + (uVar20 == 0);
    lVar25 = 0;
    local_128 = (ThreadLocal2 *)0x0;
    pTVar9 = local_128;
    local_c8 = lVar27;
    local_c0 = this;
    do {
      uVar19 = set->_end;
      local_58 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
      auStack_108 = (undefined1  [16])0x0;
      uStack_120 = 0;
      uStack_11f = 0;
      auStack_118 = (undefined1  [16])0x0;
      auStack_d8 = (undefined1  [16])0x0;
      auStack_e8 = (undefined1  [16])0x0;
      auStack_68 = (undefined1  [16])0x0;
      uStack_80 = 0;
      auStack_78 = (undefined1  [16])0x0;
      auStack_98 = (undefined1  [16])0x0;
      auStack_a8 = (undefined1  [16])0x0;
      auVar32 = ZEXT816(0) << 0x40;
      if (uVar26 < uVar19) {
        pRVar10 = (((this->createLeafFunc).bvh)->scene->geometries).items;
        pfVar28 = prims[uVar26].upper.field_0.m128 + 3;
        uVar29 = 0;
        local_128 = pTVar9;
        local_f8 = pTVar9;
        cStack_f0 = uStack_120;
        uStack_ef = uStack_11f;
        local_b8 = pTVar9;
        uStack_b0 = uStack_80;
        local_88 = pTVar9;
        local_48 = local_58;
        do {
          fVar5 = pfVar28[-4];
          fVar6 = *pfVar28;
          pGVar11 = pRVar10[(uint)fVar5].ptr;
          lVar30 = (ulong)(uint)fVar6 *
                   pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          lVar27 = *(long *)&pGVar11->field_0x58;
          lVar12 = *(long *)&pGVar11[1].time_range.upper;
          p_Var13 = pGVar11[1].intersectionFilterN;
          puVar2 = (undefined4 *)(lVar12 + (ulong)*(uint *)(lVar27 + lVar30) * (long)p_Var13);
          uVar7 = puVar2[1];
          uVar15 = puVar2[2];
          auVar32 = *(undefined1 (*) [16])
                     (lVar12 + (ulong)*(uint *)(lVar27 + 4 + lVar30) * (long)p_Var13);
          puVar3 = (undefined4 *)(lVar12 + (ulong)*(uint *)(lVar27 + 8 + lVar30) * (long)p_Var13);
          uVar16 = *puVar3;
          uVar17 = puVar3[1];
          uVar18 = puVar3[2];
          auVar36 = *(undefined1 (*) [16])
                     (lVar12 + (ulong)*(uint *)(lVar27 + 0xc + lVar30) * (long)p_Var13);
          *(undefined4 *)((long)&local_128 + uVar29 * 4) = *puVar2;
          *(undefined4 *)(auStack_118 + uVar29 * 4) = uVar7;
          *(undefined4 *)(auStack_108 + uVar29 * 4) = uVar15;
          *(int *)((long)&local_f8 + uVar29 * 4) = auVar32._0_4_;
          uVar7 = vextractps_avx(auVar32,1);
          *(undefined4 *)(auStack_e8 + uVar29 * 4) = uVar7;
          uVar7 = vextractps_avx(auVar32,2);
          *(undefined4 *)(auStack_d8 + uVar29 * 4) = uVar7;
          *(undefined4 *)((long)&local_88 + uVar29 * 4) = uVar16;
          *(undefined4 *)(auStack_78 + uVar29 * 4) = uVar17;
          *(undefined4 *)(auStack_68 + uVar29 * 4) = uVar18;
          *(int *)((long)&local_b8 + uVar29 * 4) = auVar36._0_4_;
          uVar7 = vextractps_avx(auVar36,1);
          *(undefined4 *)(auStack_a8 + uVar29 * 4) = uVar7;
          uVar7 = vextractps_avx(auVar36,2);
          *(undefined4 *)(auStack_98 + uVar29 * 4) = uVar7;
          *(float *)(local_48 + uVar29 * 4) = fVar5;
          *(float *)(local_58 + uVar29 * 4) = fVar6;
          uVar24 = uVar29 + 1;
          if (2 < uVar29) break;
          lVar27 = uVar29 + uVar26;
          pfVar28 = pfVar28 + 8;
          uVar29 = uVar24;
        } while (lVar27 + 1U < uVar19);
        auVar36[8] = uStack_120;
        auVar36._0_8_ = local_128;
        auVar36._9_7_ = uStack_11f;
        auVar35[8] = cStack_f0;
        auVar35._0_8_ = local_f8;
        auVar35._9_7_ = uStack_ef;
        auVar34._8_8_ = uStack_80;
        auVar34._0_8_ = local_88;
        auVar33._8_8_ = uStack_b0;
        auVar33._0_8_ = local_b8;
        uVar26 = uVar26 + uVar24;
        lVar27 = local_c8;
        this = local_c0;
        auVar32 = auStack_98;
      }
      else {
        local_48 = vpcmpeqd_avx(in_ZMM3._0_16_,in_ZMM3._0_16_);
        auStack_a8 = ZEXT816(0) << 0x40;
        auVar33 = ZEXT816(0) << 0x40;
        auStack_68 = ZEXT816(0) << 0x40;
        auStack_78 = ZEXT816(0) << 0x40;
        auVar34 = ZEXT816(0) << 0x40;
        auStack_d8 = ZEXT816(0) << 0x40;
        auStack_e8 = ZEXT816(0) << 0x40;
        auVar35 = ZEXT816(0) << 0x40;
        auStack_108 = ZEXT816(0) << 0x40;
        auStack_118 = ZEXT816(0) << 0x40;
        auVar36 = ZEXT816(0) << 0x40;
      }
      in_ZMM3 = ZEXT1664(local_48);
      in_ZMM1 = ZEXT1664(local_58);
      pauVar22 = (undefined1 (*) [16])(pcVar21 + lVar25 * 0xe0);
      auVar36 = vmovntps_avx(auVar36);
      *pauVar22 = auVar36;
      auVar36 = vmovntps_avx(auStack_118);
      pauVar22[1] = auVar36;
      auVar36 = vmovntps_avx(auStack_108);
      pauVar22[2] = auVar36;
      auVar36 = vmovntps_avx(auVar35);
      pauVar22[3] = auVar36;
      auVar36 = vmovntps_avx(auStack_e8);
      pauVar22[4] = auVar36;
      auVar36 = vmovntps_avx(auStack_d8);
      pauVar22[5] = auVar36;
      auVar36 = vmovntps_avx(auVar34);
      pauVar22[6] = auVar36;
      auVar36 = vmovntps_avx(auStack_78);
      pauVar22[7] = auVar36;
      auVar36 = vmovntps_avx(auStack_68);
      pauVar22[8] = auVar36;
      auVar36 = vmovntps_avx(auVar33);
      pauVar22[9] = auVar36;
      auVar36 = vmovntps_avx(auStack_a8);
      pauVar22[10] = auVar36;
      auVar32 = vmovntps_avx(auVar32);
      pauVar22[0xb] = auVar32;
      auVar32 = vmovntdq_avx(local_48);
      pauVar22[0xc] = auVar32;
      auVar32 = vmovntdq_avx(local_58);
      pauVar22[0xd] = auVar32;
      lVar25 = lVar25 + 1;
    } while (lVar25 != lVar27);
  }
  uVar19 = 7;
  if (uVar20 < 7) {
    uVar19 = uVar20;
  }
  return (NodeRef)(uVar19 | (ulong)pcVar21 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }